

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkElement.cpp
# Opt level: O3

void __thiscall
iDynTree::LinkElement::childHasBeenParsed(LinkElement *this,shared_ptr<iDynTree::XMLElement> *child)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  VisualElement *this_01;
  VisualInfo *__x;
  long lVar3;
  long *local_48 [2];
  long local_38 [2];
  
  iDynTree::XMLElement::name_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (iVar2 == 0) {
    lVar3 = 0xa8;
  }
  else {
    iDynTree::XMLElement::name_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (iVar2 != 0) {
      return;
    }
    lVar3 = 0xc0;
  }
  peVar1 = (child->super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (this_01 = (VisualElement *)
                __dynamic_cast(peVar1,&XMLElement::typeinfo,&VisualElement::typeinfo,0),
     this_01 == (VisualElement *)0x0)) {
    iDynTree::reportError
              ("LinkElement","childHasBeenParsed",
               "Expecting a VisualElement for visual/collision child. Got another element instead.")
    ;
    return;
  }
  this_00 = (child->super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  __x = VisualElement::visualInfo(this_01);
  std::
  vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>
  ::push_back((vector<iDynTree::VisualElement::VisualInfo,_std::allocator<iDynTree::VisualElement::VisualInfo>_>
               *)(&this->super_XMLElement + lVar3),__x);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void LinkElement::childHasBeenParsed(std::shared_ptr<iDynTree::XMLElement> child)
    {
        std::vector<VisualElement::VisualInfo>* visualContainer = nullptr;
        if (child->name() == "visual") {
            visualContainer = &m_visuals;
        } else if (child->name() == "collision") {
            visualContainer = &m_collisions;
        } else {
            return;
        }
        std::shared_ptr<VisualElement> visualElement = std::dynamic_pointer_cast<VisualElement>(child);
        if (!visualElement) {
            reportError("LinkElement", "childHasBeenParsed", "Expecting a VisualElement for visual/collision child. Got another element instead.");
            return;
        }
        visualContainer->push_back(visualElement->visualInfo());
    }